

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# student.h
# Opt level: O2

vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
* __thiscall
CP::stack<int>::distribute
          (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           *__return_storage_ptr__,stack<int> *this,size_t k)

{
  long lVar1;
  ulong uVar2;
  size_t sVar3;
  long lVar4;
  bool bVar5;
  allocator_type local_59;
  ulong local_58;
  size_t local_50;
  size_t local_48;
  ulong local_40;
  long local_38;
  
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(__return_storage_ptr__,k,&local_59);
  uVar2 = this->mSize;
  local_58 = uVar2 / k;
  local_40 = uVar2 % k;
  local_38 = uVar2 - 1;
  sVar3 = 0;
  local_50 = k;
  while (sVar3 != local_50) {
    bVar5 = local_40 == 0;
    local_40 = local_40 - 1;
    if (bVar5) {
      local_40 = 0;
    }
    lVar1 = local_58 + 1;
    local_38 = (long)(int)local_38;
    lVar4 = local_38 * 4;
    local_48 = sVar3;
    for (uVar2 = 0; uVar2 < lVar1 - (ulong)bVar5; uVar2 = uVar2 + 1) {
      std::vector<int,_std::allocator<int>_>::push_back
                ((__return_storage_ptr__->
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + sVar3,
                 (value_type *)((long)this->mData + lVar4));
      lVar4 = lVar4 + -4;
    }
    local_38 = local_38 - uVar2;
    sVar3 = local_48 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::vector<T>> CP::stack<T>::distribute(size_t k) const {
    std::vector<std::vector<T>> v(k);
    size_t least = mSize / k;
    size_t remain = mSize % k;
    int ind = mSize - 1;
    for (size_t i = 0; i < k; ++i) {
      size_t size = least; 
      if (remain > 0) {
        size++;
        remain--;
      }
      for (size_t j = 0; j < size; ++j) {
        v[i].push_back(*(mData+(ind--)));
      }
    }
    return v;
}